

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

typed_option<int> * __thiscall
VW::config::typed_option<int>::value(typed_option<int> *this,int value)

{
  typed_option<int> *in_RDI;
  int *in_stack_00000008;
  shared_ptr<int> *in_stack_ffffffffffffffe0;
  
  std::make_shared<int,int&>(in_stack_00000008);
  std::shared_ptr<int>::operator=(in_stack_ffffffffffffffe0,(shared_ptr<int> *)in_RDI);
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x3315f4);
  return in_RDI;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }